

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

void __thiscall Json::StyledWriter::writeValue(StyledWriter *this,Value *value)

{
  pointer *__return_storage_ptr__;
  bool bVar1;
  ValueType VVar2;
  Json *pJVar3;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__lhs;
  bool value_00;
  LargestInt value_01;
  LargestUInt value_02;
  char *value_03;
  double value_04;
  undefined1 auVar4 [16];
  allocator<char> local_1b9;
  string local_1b8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_198;
  string local_190;
  Value *local_170;
  Value *childValue;
  string *name;
  iterator it;
  string local_150;
  allocator<char> local_129;
  string local_128;
  undefined1 local_108 [8];
  Members members;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  allocator<char> local_39;
  string local_38;
  Value *local_18;
  Value *value_local;
  StyledWriter *this_local;
  
  local_18 = value;
  value_local = (Value *)this;
  VVar2 = Value::type(value);
  switch(VVar2) {
  case nullValue:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"null",&local_39);
    pushValue(this,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
    break;
  case intValue:
    pJVar3 = (Json *)Value::asLargestInt(local_18);
    valueToString_abi_cxx11_(&local_70,pJVar3,value_01);
    pushValue(this,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    break;
  case uintValue:
    pJVar3 = (Json *)Value::asLargestUInt(local_18);
    valueToString_abi_cxx11_(&local_90,pJVar3,value_02);
    pushValue(this,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    break;
  case realValue:
    value_04 = Value::asDouble(local_18);
    valueToString_abi_cxx11_(&local_b0,(Json *)value,value_04);
    pushValue(this,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    break;
  case stringValue:
    pJVar3 = (Json *)Value::asCString(local_18);
    valueToQuotedString_abi_cxx11_(&local_d0,pJVar3,value_03);
    pushValue(this,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    break;
  case booleanValue:
    bVar1 = Value::asBool(local_18);
    __return_storage_ptr__ =
         &members.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
    valueToString_abi_cxx11_((string *)__return_storage_ptr__,(Json *)(ulong)bVar1,value_00);
    pushValue(this,(string *)__return_storage_ptr__);
    std::__cxx11::string::~string
              ((string *)
               &members.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    break;
  case arrayValue:
    writeArrayValue(this,local_18);
    break;
  case objectValue:
    Value::getMemberNames_abi_cxx11_((Members *)local_108,local_18);
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_108);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"{}",&local_129);
      pushValue(this,&local_128);
      std::__cxx11::string::~string((string *)&local_128);
      std::allocator<char>::~allocator(&local_129);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_150,"{",(allocator<char> *)((long)&it._M_current + 7));
      writeWithIndent(this,&local_150);
      std::__cxx11::string::~string((string *)&local_150);
      std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_current + 7));
      indent(this);
      name = (string *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_108);
      while( true ) {
        childValue = (Value *)__gnu_cxx::
                              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ::operator*((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)&name);
        local_170 = Value::operator[](local_18,(string *)childValue);
        writeCommentBeforeValue(this,local_170);
        auVar4 = std::__cxx11::string::c_str();
        valueToQuotedString_abi_cxx11_(&local_190,auVar4._0_8_,auVar4._8_8_);
        writeWithIndent(this,&local_190);
        std::__cxx11::string::~string((string *)&local_190);
        std::__cxx11::string::operator+=((string *)&this->document_," : ");
        writeValue(this,local_170);
        __lhs = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator++((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&name);
        local_198._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_108);
        bVar1 = __gnu_cxx::operator==(__lhs,&local_198);
        if (bVar1) break;
        std::__cxx11::string::operator+=((string *)&this->document_,",");
        writeCommentAfterValueOnSameLine(this,local_170);
      }
      writeCommentAfterValueOnSameLine(this,local_170);
      unindent(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,"}",&local_1b9);
      writeWithIndent(this,&local_1b8);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::allocator<char>::~allocator(&local_1b9);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_108);
  }
  return;
}

Assistant:

void 
StyledWriter::writeValue( const Value &value )
{
   switch ( value.type() )
   {
   case nullValue:
      pushValue( "null" );
      break;
   case intValue:
      pushValue( valueToString( value.asLargestInt() ) );
      break;
   case uintValue:
      pushValue( valueToString( value.asLargestUInt() ) );
      break;
   case realValue:
      pushValue( valueToString( value.asDouble() ) );
      break;
   case stringValue:
      pushValue( valueToQuotedString( value.asCString() ) );
      break;
   case booleanValue:
      pushValue( valueToString( value.asBool() ) );
      break;
   case arrayValue:
      writeArrayValue( value);
      break;
   case objectValue:
      {
         Value::Members members( value.getMemberNames() );
         if ( members.empty() )
            pushValue( "{}" );
         else
         {
            writeWithIndent( "{" );
            indent();
            Value::Members::iterator it = members.begin();
            for (;;)
            {
               const std::string &name = *it;
               const Value &childValue = value[name];
               writeCommentBeforeValue( childValue );
               writeWithIndent( valueToQuotedString( name.c_str() ) );
               document_ += " : ";
               writeValue( childValue );
               if ( ++it == members.end() )
               {
                  writeCommentAfterValueOnSameLine( childValue );
                  break;
               }
               document_ += ",";
               writeCommentAfterValueOnSameLine( childValue );
            }
            unindent();
            writeWithIndent( "}" );
         }
      }
      break;
   }
}